

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

bool __thiscall PhyloTree::removeSplit(PhyloTree *this,Bipartition *e)

{
  bool bVar1;
  size_type sVar2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  long in_RDI;
  Bipartition *in_stack_00000008;
  PhyloTreeEdge *in_stack_00000010;
  size_t i;
  bool removed;
  undefined1 local_29;
  undefined8 local_20;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar3;
  
  bVar3 = 0;
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RDI + 0x20));
    local_29 = 0;
    if (local_20 < sVar2) {
      local_29 = bVar3 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RDI + 0x20),local_20);
    bVar1 = PhyloTreeEdge::sameBipartition(in_stack_00000010,in_stack_00000008);
    if (bVar1) {
      Tools::vector_remove_element_at_index<PhyloTreeEdge>
                (in_RSI,CONCAT17(bVar3,in_stack_ffffffffffffffe8));
      bVar3 = 1;
    }
    local_20 = local_20 + 1;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool PhyloTree::removeSplit(const Bipartition &e) {
    bool removed = false;
    size_t i = 0;
    while (i < edges.size() && !removed) {
        if (edges[i].sameBipartition(e)) {
            Tools::vector_remove_element_at_index(edges, i);
            removed = true;
        }
        i++;
    }
    return removed;
}